

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

cmValue __thiscall
cmConditionEvaluator::GetDefinitionIfUnquoted
          (cmConditionEvaluator *this,cmExpandedCommandArgument *argument)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  cmValue cVar4;
  cmListFileContext *context;
  ostream *poVar5;
  cmake *this_00;
  PolicyID id;
  string local_1c0;
  ostringstream e;
  
  if ((this->Policy54Status < NEW) ||
     (bVar2 = cmExpandedCommandArgument::WasQuoted(argument), !bVar2)) {
    pcVar1 = this->Makefile;
    psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
    cVar4 = cmMakefile::GetDefinition(pcVar1,psVar3);
    if (cVar4.Value != (string *)0x0) {
      bVar2 = cmExpandedCommandArgument::WasQuoted(argument);
      if (!bVar2) {
        return (cmValue)cVar4.Value;
      }
      if (this->Policy54Status != WARN) {
        return (cmValue)cVar4.Value;
      }
      pcVar1 = this->Makefile;
      context = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                          (&(this->Backtrace).
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
      bVar2 = cmMakefile::HasCMP0054AlreadyBeenReported(pcVar1,context);
      if (bVar2) {
        return (cmValue)cVar4.Value;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)0x36,id);
      poVar5 = std::operator<<((ostream *)&e,(string *)&local_1c0);
      poVar5 = std::operator<<(poVar5,"\nQuoted variables like \"");
      psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
      poVar5 = std::operator<<(poVar5,(string *)psVar3);
      std::operator<<(poVar5,
                      "\" will no longer be dereferenced when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                     );
      std::__cxx11::string::~string((string *)&local_1c0);
      this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_1c0,&this->Backtrace);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return (cmValue)cVar4.Value;
    }
  }
  return (cmValue)(string *)0x0;
}

Assistant:

cmValue cmConditionEvaluator::GetDefinitionIfUnquoted(
  cmExpandedCommandArgument const& argument) const
{
  if ((this->Policy54Status != cmPolicies::WARN &&
       this->Policy54Status != cmPolicies::OLD) &&
      argument.WasQuoted()) {
    return nullptr;
  }

  cmValue def = this->Makefile.GetDefinition(argument.GetValue());

  if (def && argument.WasQuoted() &&
      this->Policy54Status == cmPolicies::WARN) {
    if (!this->Makefile.HasCMP0054AlreadyBeenReported(this->Backtrace.Top())) {
      std::ostringstream e;
      // clang-format off
      e << (cmPolicies::GetPolicyWarning(cmPolicies::CMP0054))
        << "\n"
           "Quoted variables like \"" << argument.GetValue() << "\" "
           "will no longer be dereferenced when the policy is set to NEW.  "
           "Since the policy is not set the OLD behavior will be used.";
      // clang-format on

      this->Makefile.GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, e.str(), this->Backtrace);
    }
  }

  return def;
}